

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_goto_array_element(coda_cursor_conflict *cursor,int num_subs,long *subs)

{
  int iVar1;
  coda_type *local_60;
  long local_58;
  int64_t bit_size;
  int64_t var_dim;
  long dim;
  long i;
  long offset_elements;
  coda_type_array *array;
  long *subs_local;
  coda_cursor_conflict *pcStack_18;
  int num_subs_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_60 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_60 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  offset_elements = (long)local_60;
  array = (coda_type_array *)subs;
  subs_local._4_4_ = num_subs;
  pcStack_18 = cursor;
  if (num_subs == *(int *)&local_60[1].name) {
    i = 0;
    for (dim = 0; dim < *(int *)(offset_elements + 0x48); dim = dim + 1) {
      if (*(long *)(offset_elements + 0x50 + dim * 8) == -1) {
        iVar1 = coda_expression_eval_integer
                          (*(coda_expression **)(offset_elements + 0x90 + dim * 8),pcStack_18,
                           &bit_size);
        if (iVar1 != 0) {
          coda_add_error_message(" for dim[%d] expression",dim);
          coda_cursor_add_to_error_message(pcStack_18);
          return -1;
        }
        var_dim = bit_size;
      }
      else {
        var_dim = *(int64_t *)(offset_elements + 0x50 + dim * 8);
      }
      if ((array->dim[dim + -10] < 0) || (var_dim <= array->dim[dim + -10])) {
        coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",array->dim[dim + -10],
                       var_dim);
        return -1;
      }
      if (0 < dim) {
        i = var_dim * i;
      }
      i = array->dim[dim + -10] + i;
    }
    pcStack_18->n = pcStack_18->n + 1;
    pcStack_18->stack[pcStack_18->n + -1].bit_offset =
         pcStack_18->stack[pcStack_18->n + -2].bit_offset;
    if (*(long *)(*(long *)(offset_elements + 0x38) + 0x20) < 0) {
      for (dim = 0; dim < i; dim = dim + 1) {
        pcStack_18->stack[pcStack_18->n + -1].type =
             *(coda_dynamic_type_struct **)(offset_elements + 0x38);
        pcStack_18->stack[pcStack_18->n + -1].index = dim;
        iVar1 = coda_cursor_get_bit_size(pcStack_18,&local_58);
        if (iVar1 != 0) {
          pcStack_18->n = pcStack_18->n + -1;
          return -1;
        }
        iVar1 = pcStack_18->n + -1;
        pcStack_18->stack[iVar1].bit_offset = local_58 + pcStack_18->stack[iVar1].bit_offset;
      }
    }
    else {
      iVar1 = pcStack_18->n + -1;
      pcStack_18->stack[iVar1].bit_offset =
           i * *(long *)(*(long *)(offset_elements + 0x38) + 0x20) +
           pcStack_18->stack[iVar1].bit_offset;
    }
    pcStack_18->stack[pcStack_18->n + -1].type =
         *(coda_dynamic_type_struct **)(offset_elements + 0x38);
    pcStack_18->stack[pcStack_18->n + -1].index = i;
    cursor_local._4_4_ = 0;
  }
  else {
    coda_set_error(-0x6a,"number of dimensions argument (%d) does not match rank of  array (%d)",
                   (ulong)(uint)num_subs,(ulong)*(uint *)&local_60[1].name);
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascbin_cursor_goto_array_element(coda_cursor *cursor, int num_subs, const long subs[])
{
    coda_type_array *array;
    long offset_elements;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the number of dimensions */
    if (num_subs != array->num_dims)
    {
        coda_set_error(CODA_ERROR_ARRAY_NUM_DIMS_MISMATCH, "number of dimensions argument (%d) does not match rank of "
                       " array (%d)", num_subs, array->num_dims);
        return -1;
    }

    /* check the dimensions... */
    offset_elements = 0;
    for (i = 0; i < array->num_dims; i++)
    {
        long dim;

        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim = (long)var_dim;
        }
        else
        {
            dim = array->dim[i];
        }

        if (subs[i] < 0 || subs[i] >= dim)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", subs[i],
                           dim);
            return -1;
        }
        if (i > 0)
        {
            offset_elements *= dim;
        }
        offset_elements += subs[i];
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += offset_elements * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < offset_elements; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = offset_elements;

    return 0;
}